

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

string * __thiscall
gnuplotio::Gnuplot::
binaryFile<boost::tuples::tuple<int(&)[3],boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,Gnuplot *this,long *arg,string *filename,
          undefined8 arr_or_rec)

{
  ostream *poVar1;
  ostringstream cmdline;
  fstream tmp_stream;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  undefined1 local_3b8 [376];
  string local_240 [16];
  
  if (*(long *)(filename + 8) == 0) {
    GnuplotTmpfileCollection::make_tmpfile_abi_cxx11_
              (local_240,
               (this->tmp_files).
               super___shared_ptr<gnuplotio::GnuplotTmpfileCollection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::__cxx11::string::operator=(filename,(string *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
      operator_delete(local_240[0]._M_dataplus._M_p,local_240[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::fstream::fstream(local_240,*(char **)filename,_S_out|_S_bin);
  local_3b8._0_8_ = *arg;
  local_3b8._16_8_ = arg[1];
  local_3b8._8_8_ = local_3b8._0_8_ + 0xc;
  local_3b8._24_8_ = local_3b8._16_8_ + 0xc;
  print_block<1ul,gnuplotio::PairOfRange<gnuplotio::IteratorRange<int_const*,int>,gnuplotio::IteratorRange<int_const*,int>>,gnuplotio::ModeBinary>
            (&local_240[0].field_2);
  std::fstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8," \'",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3b8,*(char **)filename,*(long *)(filename + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' binary",8);
  binfmt<boost::tuples::tuple<int(&)[3],boost::array<int,3ul>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,gnuplotio::Mode1D>
            (&local_3d8,this,arg,arr_or_rec);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_3d8,local_3d0);
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8,local_3c8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
  std::ios_base::~ios_base((ios_base *)(local_3b8 + 0x70));
  std::fstream::~fstream(local_240);
  return __return_storage_ptr__;
}

Assistant:

std::string binaryFile(const T &arg, std::string filename, const std::string &arr_or_rec, OrganizationMode) {
        if(filename.empty()) filename = make_tmpfile();
        std::fstream tmp_stream(filename.c_str(), std::fstream::out | std::fstream::binary);
        top_level_array_sender(tmp_stream, arg, OrganizationMode(), ModeBinary());
        tmp_stream.close();

        std::ostringstream cmdline;
        // FIXME - hopefully filename doesn't contain quotes or such...
        cmdline << " '" << filename << "' binary" << binfmt(arg, arr_or_rec, OrganizationMode());
        return cmdline.str();
    }